

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

void polymul_internal::polynomial_multiplier<double,_4,_0,_3>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar2 = binomial(6,2);
  iVar3 = binomial(7,3);
  if (iVar2 < iVar3) {
    lVar4 = (long)iVar2;
    do {
      dVar1 = *p1;
      iVar2 = binomial(6,2);
      dst[lVar4] = dVar1 * m2[lVar4 - iVar2] + dst[lVar4];
      lVar4 = lVar4 + 1;
      iVar2 = binomial(7,3);
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    for (int i = binomial(Nvar + Ndeg2 - 1, Ndeg2 - 1);
         i < binomial(Nvar + Ndeg2, Ndeg2);
         i++)
      dst[i] += p1[0] * m2[i - binomial(Nvar + Ndeg2 - 1, Ndeg2 - 1)];
  }